

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

void rxa2_fill_first_blocks(uint8_t *blockhash,argon2_instance_t *instance)

{
  long in_RSI;
  long in_RDI;
  uint8_t blockhash_bytes [1024];
  uint32_t l;
  void *in_stack_fffffffffffffbe8;
  block *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffd68;
  void *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(uint *)(in_RSI + 0x1c); local_14 = local_14 + 1) {
    store32((void *)(in_RDI + 0x40),0);
    store32((void *)(in_RDI + 0x44),local_14);
    randomx_blake2b_long
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd68);
    load_block(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    store32((void *)(in_RDI + 0x40),1);
    randomx_blake2b_long
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd68);
    load_block(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  }
  return;
}

Assistant:

void rxa2_fill_first_blocks(uint8_t *blockhash, const argon2_instance_t *instance) {
	uint32_t l;
	/* Make the first and second block in each lane as G(H0||0||i) or
	   G(H0||1||i) */
	uint8_t blockhash_bytes[ARGON2_BLOCK_SIZE];
	for (l = 0; l < instance->lanes; ++l) {

		store32(blockhash + ARGON2_PREHASH_DIGEST_LENGTH, 0);
		store32(blockhash + ARGON2_PREHASH_DIGEST_LENGTH + 4, l);
		blake2b_long(blockhash_bytes, ARGON2_BLOCK_SIZE, blockhash,
			ARGON2_PREHASH_SEED_LENGTH);
		load_block(&instance->memory[l * instance->lane_length + 0],
			blockhash_bytes);

		store32(blockhash + ARGON2_PREHASH_DIGEST_LENGTH, 1);
		blake2b_long(blockhash_bytes, ARGON2_BLOCK_SIZE, blockhash,
			ARGON2_PREHASH_SEED_LENGTH);
		load_block(&instance->memory[l * instance->lane_length + 1],
			blockhash_bytes);
	}
}